

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

size_t mpp_av1_get_payload_bytes_left(BitReadCtx_t *gbc)

{
  RK_S32 RVar1;
  MPP_RET MVar2;
  RK_S32 local_2c;
  int local_28;
  RK_S32 _out;
  RK_S32 i;
  RK_U8 value;
  size_t size;
  BitReadCtx_t *gbc_local;
  
  _i = 0;
  _out._3_1_ = '\0';
  local_28 = 0;
  size = (size_t)gbc;
  while( true ) {
    RVar1 = mpp_get_bits_left((BitReadCtx_t *)size);
    if (RVar1 < 8) {
      return _i;
    }
    MVar2 = mpp_read_bits((BitReadCtx_t *)size,8,&local_2c);
    *(MPP_RET *)(size + 0x44) = MVar2;
    if (*(int *)(size + 0x44) != 0) break;
    _out._3_1_ = (char)local_2c;
    if (_out._3_1_ != '\0') {
      _i = (size_t)local_28;
    }
    local_28 = local_28 + 1;
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t mpp_av1_get_payload_bytes_left(BitReadCtx_t *gbc)
{
    size_t size = 0;
    RK_U8 value = 0;
    RK_S32 i = 0;

    for (i = 0; mpp_get_bits_left(gbc) >= 8; i++) {
        READ_BITS(gbc, 8, &value);
        if (value)
            size = i;
    }
    return size;

__bitread_error:
    return MPP_NOK;

}